

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolveAnalysis.cpp
# Opt level: O2

void __thiscall
HPresolveAnalysis::setup
          (HPresolveAnalysis *this,HighsLp *model_,HighsOptions *options_,HighsInt *numDeletedRows_,
          HighsInt *numDeletedCols_)

{
  uint uVar1;
  HighsOptions *pHVar2;
  HighsInt HVar3;
  bool bVar4;
  ulong *puVar5;
  uint uVar6;
  ulong __n;
  reference rVar7;
  string local_50;
  
  this->model = model_;
  this->options = options_;
  this->numDeletedRows = numDeletedRows_;
  this->numDeletedCols = numDeletedCols_;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&this->allow_rule_,0xe,true);
  if ((this->options->super_HighsOptionsStruct).presolve_rule_off != 0) {
    uVar6 = 1;
    highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                 "Presolve rules not allowed:\n");
    for (__n = 0; __n != 0xe; __n = __n + 1) {
      pHVar2 = this->options;
      uVar1 = (pHVar2->super_HighsOptionsStruct).presolve_rule_off;
      if (__n < 6) {
        if ((uVar1 & uVar6) != 0) {
          utilPresolveRuleTypeToString_abi_cxx11_(&local_50,(HighsInt)__n);
          highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kWarning,
                       "Cannot disallow rule %2d (bit %4d): %s\n",__n & 0xffffffff,(ulong)uVar6,
                       local_50._M_dataplus._M_p);
          goto LAB_0031cf2d;
        }
      }
      else {
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->allow_rule_,__n);
        puVar5 = rVar7._M_p;
        if ((uVar1 & uVar6) == 0) {
          *puVar5 = *puVar5 | rVar7._M_mask;
        }
        else {
          *puVar5 = *puVar5 & ~rVar7._M_mask;
          pHVar2 = this->options;
          utilPresolveRuleTypeToString_abi_cxx11_(&local_50,(HighsInt)__n);
          highsLogUser(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
                       "   Rule %2d (bit %4d): %s\n",__n & 0xffffffff,(ulong)uVar6,
                       local_50._M_dataplus._M_p);
LAB_0031cf2d:
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      uVar6 = uVar6 * 2;
    }
  }
  if ((options_->super_HighsOptionsStruct).presolve_rule_logging == true) {
    bVar4 = HighsLp::isMip(model_);
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  this->allow_logging_ = bVar4;
  this->logging_on_ = bVar4;
  this->log_rule_type_ = -1;
  this->num_deleted_rows0_ = 0;
  this->num_deleted_cols0_ = 0;
  HighsPresolveLog::clear(&this->presolve_log_);
  HVar3 = this->model->num_row_;
  this->original_num_col_ = this->model->num_col_;
  this->original_num_row_ = HVar3;
  return;
}

Assistant:

void HPresolveAnalysis::setup(const HighsLp* model_,
                              const HighsOptions* options_,
                              const HighsInt& numDeletedRows_,
                              const HighsInt& numDeletedCols_) {
  model = model_;
  options = options_;
  numDeletedRows = &numDeletedRows_;
  numDeletedCols = &numDeletedCols_;

  this->allow_rule_.assign(kPresolveRuleCount, true);

  if (options->presolve_rule_off) {
    // Some presolve rules are off
    //
    // Transform options->presolve_rule_off into logical settings in
    // allow_rule_[*], commenting on the rules switched off
    highsLogUser(options->log_options, HighsLogType::kInfo,
                 "Presolve rules not allowed:\n");
    HighsInt bit = 1;
    for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
         rule_type++) {
      // Identify whether this rule is allowed
      const bool allow = !(options->presolve_rule_off & bit);
      if (rule_type >= kPresolveRuleFirstAllowOff) {
        // This is a rule that can be switched off, so comment
        // positively if it is off
        allow_rule_[rule_type] = allow;
        if (!allow)
          highsLogUser(options->log_options, HighsLogType::kInfo,
                       "   Rule %2d (bit %4d): %s\n", (int)rule_type, (int)bit,
                       utilPresolveRuleTypeToString(rule_type).c_str());
      } else if (!allow) {
        // This is a rule that cannot be switched off so, if an
        // attempt is made, don't allow it to be off and comment
        // negatively
        highsLogUser(options->log_options, HighsLogType::kWarning,
                     "Cannot disallow rule %2d (bit %4d): %s\n", (int)rule_type,
                     (int)bit, utilPresolveRuleTypeToString(rule_type).c_str());
      }
      bit *= 2;
    }
  }
  // Allow logging if option is set and model is not a MIP
  allow_logging_ = options_->presolve_rule_logging && !model_->isMip();
  logging_on_ = allow_logging_;
  log_rule_type_ = kPresolveRuleIllegal;
  resetNumDeleted();
  presolve_log_.clear();
  original_num_col_ = model->num_col_;
  original_num_row_ = model->num_row_;
}